

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError PaUtil_DeviceIndexToHostApiDeviceIndex
                  (PaDeviceIndex *hostApiDevice,PaDeviceIndex device,
                  PaUtilHostApiRepresentation *hostApi)

{
  int iVar1;
  PaDeviceIndex x;
  PaError result;
  PaUtilHostApiRepresentation *hostApi_local;
  PaDeviceIndex device_local;
  PaDeviceIndex *hostApiDevice_local;
  
  iVar1 = device - (int)(hostApi->privatePaFrontInfo).baseDeviceIndex;
  if ((iVar1 < 0) || ((hostApi->info).deviceCount <= iVar1)) {
    result = -0x270c;
  }
  else {
    *hostApiDevice = iVar1;
    result = 0;
  }
  return result;
}

Assistant:

PaError PaUtil_DeviceIndexToHostApiDeviceIndex(
        PaDeviceIndex *hostApiDevice, PaDeviceIndex device, struct PaUtilHostApiRepresentation *hostApi )
{
    PaError result;
    PaDeviceIndex x;

    x = device - hostApi->privatePaFrontInfo.baseDeviceIndex;

    if( x < 0 || x >= hostApi->info.deviceCount )
    {
        result = paInvalidDevice;
    }
    else
    {
        *hostApiDevice = x;
        result = paNoError;
    }

    return result;
}